

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DelaySyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,ExpressionSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  DelaySyntax *pDVar6;
  
  pDVar6 = (DelaySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DelaySyntax *)this->endPtr < pDVar6 + 1) {
    pDVar6 = (DelaySyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pDVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pDVar6->super_TimingControlSyntax).super_SyntaxNode.kind = *args;
  (pDVar6->super_TimingControlSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar6->super_TimingControlSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar6->hash).kind = TVar2;
  (pDVar6->hash).field_0x2 = uVar3;
  (pDVar6->hash).numFlags = (NumericTokenFlags)NVar4.raw;
  (pDVar6->hash).rawLen = uVar5;
  (pDVar6->hash).info = pIVar1;
  (pDVar6->delayValue).ptr = args_2;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pDVar6;
  return pDVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }